

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::relocate
          (QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition> *this,
          qsizetype offset,PositionalArgumentDefinition **data)

{
  bool bVar1;
  PositionalArgumentDefinition *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  PositionalArgumentDefinition *res;
  
  first = (PositionalArgumentDefinition *)(*(long *)(in_RDI + 8) + in_RSI * 0x48);
  QtPrivate::q_relocate_overlap_n<QCommandLineParserPrivate::PositionalArgumentDefinition,long_long>
            (first,in_RDI,(PositionalArgumentDefinition *)0x6fad54);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>,QCommandLineParserPrivate::PositionalArgumentDefinition_const*>
                        (data,(QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>
                               *)res), bVar1)) {
    *in_RDX = in_RSI * 0x48 + *in_RDX;
  }
  *(PositionalArgumentDefinition **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }